

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

void spell_charm_person(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  char *txt;
  CHAR_DATA *ch_00;
  int iVar2;
  AFFECT_DATA af;
  AFFECT_DATA AStack_98;
  
  bVar1 = is_safe(ch,(CHAR_DATA *)vo);
  if (!bVar1) {
    if ((CHAR_DATA *)vo == ch) {
      txt = "You like yourself even better!\n\r";
LAB_002b0f40:
      send_to_char(txt,ch);
      return;
    }
    bVar1 = is_affected_by((CHAR_DATA *)vo,0x12);
    if (!bVar1) {
      bVar1 = is_affected_by(ch,0x12);
      if (((!bVar1) && (*(short *)((long)vo + 0x138) <= level)) &&
         ((*(byte *)((long)vo + 0x1b0) & 2) == 0)) {
        bVar1 = is_npc((CHAR_DATA *)vo);
        if ((!bVar1) || ((*(byte *)((long)vo + 0x180) & 0x20) == 0)) {
          bVar1 = saves_spell(level + -3,(CHAR_DATA *)vo,0x11);
          if (!bVar1) {
            iVar2 = 0;
            for (ch_00 = char_list; ch_00 != (CHAR_DATA *)0x0; ch_00 = ch_00->next) {
              if (ch_00->leader == ch) {
                bVar1 = is_affected_by(ch_00,0x12);
                iVar2 = iVar2 + (uint)bVar1;
              }
            }
            if (((ch->level < 0x28) && (0 < iVar2)) || (2 < iVar2 || 1 < iVar2 && ch->level < 0x34))
            {
              txt = "You already control as many charmies as you can.\n\r";
              goto LAB_002b0f40;
            }
            if (*(long *)((long)vo + 0x10) != 0) {
              stop_follower((CHAR_DATA *)vo);
            }
            add_follower((CHAR_DATA *)vo,ch);
            *(CHAR_DATA **)((long)vo + 0x18) = ch;
            init_affect(&AStack_98);
            AStack_98.where = 0;
            AStack_98.aftype = 0;
            AStack_98.level = (short)level;
            iVar2 = level + 3;
            if (-1 < level) {
              iVar2 = level;
            }
            AStack_98.type = (short)sn;
            iVar2 = number_fuzzy(iVar2 >> 2);
            AStack_98.duration = (short)iVar2;
            AStack_98.location = 0;
            AStack_98.modifier = 0;
            AStack_98.mod_name = 7;
            AStack_98.bitvector[0]._2_1_ = AStack_98.bitvector[0]._2_1_ | 4;
            affect_to_char((CHAR_DATA *)vo,&AStack_98);
            act("Isn\'t $n just so nice?",ch,(void *)0x0,vo,2);
            act("$N looks at you with adoring eyes.",ch,(void *)0x0,vo,3);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void spell_charm_person(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;
	CHAR_DATA *check;
	int count;

	count = 0;

	if (is_safe(ch, victim))
		return;

	if (victim == ch)
	{
		send_to_char("You like yourself even better!\n\r", ch);
		return;
	}

	if (is_affected_by(victim, AFF_CHARM)
		|| is_affected_by(ch, AFF_CHARM)
		|| level < victim->level
		|| IS_SET(victim->imm_flags, IMM_CHARM)
		|| (is_npc(victim) && IS_SET(victim->act, ACT_AGGRESSIVE))
		|| saves_spell(level - 3, victim, DAM_CHARM))
	{
		return;
	}

	for (check = char_list; check != nullptr; check = check->next)
	{
		if (check->leader == ch && is_affected_by(check, AFF_CHARM))
			count++;
	}

	if ((ch->level < 40 && count > 0) || (ch->level < 52 && count > 1) || count > 2)
	{
		send_to_char("You already control as many charmies as you can.\n\r", ch);
		return;
	}

	if (victim->master)
		stop_follower(victim);

	add_follower(victim, ch);

	victim->leader = ch;

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.level = level;
	af.duration = number_fuzzy(level / 4);
	af.location = 0;
	af.modifier = 0;
	af.mod_name = MOD_CONC;

	SET_BIT(af.bitvector, AFF_CHARM);

	affect_to_char(victim, &af);

	act("Isn't $n just so nice?", ch, nullptr, victim, TO_VICT);

	if (ch != victim)
		act("$N looks at you with adoring eyes.", ch, nullptr, victim, TO_CHAR);
}